

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

void __thiscall
imrt::EvaluationFunction::generate_linear_system
          (EvaluationFunction *this,Plan *p,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax)

{
  Station *this_00;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  ostream *poVar5;
  reference ppSVar6;
  Matrix *this_01;
  reference piVar7;
  vector<double,_std::allocator<double>_> *in_RCX;
  Plan *in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  int b;
  iterator __end5;
  iterator __begin5;
  list<int,_std::allocator<int>_> *__range5;
  double ap_dose_per_intensity;
  int a;
  Matrix *D;
  Station *s;
  const_iterator __end3;
  const_iterator __begin3;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__range3;
  bool flag_1;
  int ap;
  int k_1;
  int o_1;
  int k;
  double pen;
  int o;
  bool flag;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_stack_fffffffffffffee8;
  _List_const_iterator<imrt::Station_*> *in_stack_fffffffffffffef0;
  int iVar8;
  Station *in_stack_ffffffffffffff00;
  _Self local_b8;
  _Self local_b0 [2];
  int in_stack_ffffffffffffff64;
  Station *in_stack_ffffffffffffff68;
  double local_88;
  int local_7c;
  _Self local_68;
  _Self local_60;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *local_58;
  byte local_49;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  undefined8 local_38;
  int local_30;
  byte local_29;
  vector<double,_std::allocator<double>_> *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  Plan *local_10;
  
  local_29 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  for (local_30 = 0; local_30 < *(int *)(in_RDI + 0x48); local_30 = local_30 + 1) {
    local_38 = 0;
    local_3c = 0;
    while( true ) {
      iVar8 = local_3c;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)local_30);
      if (*pvVar3 <= iVar8) break;
      if ((local_29 & 1) != 0) {
        std::operator<<((ostream *)&std::cout," + ");
      }
      local_29 = 1;
      if (local_3c == 0) {
        std::operator<<((ostream *)&std::cout,"(");
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_30);
      if ((*pvVar4 != 0.0) || (NAN(*pvVar4))) {
        poVar5 = std::operator<<((ostream *)&std::cout,"max(");
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_30);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
        poVar5 = std::operator<<(poVar5,"- Z_");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_30);
        poVar5 = std::operator<<(poVar5,"_");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_3c);
        std::operator<<(poVar5,", 0)^2");
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"max(Z_");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_30);
        poVar5 = std::operator<<(poVar5,"_");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_3c);
        poVar5 = std::operator<<(poVar5,"-");
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_30);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
        std::operator<<(poVar5,", 0)^2");
      }
      iVar8 = local_3c;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)local_30);
      if (iVar8 == *pvVar3 + -1) {
        std::operator<<((ostream *)&std::cout,")");
      }
      local_3c = local_3c + 1;
    }
    in_stack_ffffffffffffff00 = (Station *)std::operator<<((ostream *)&std::cout,"/");
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)local_30);
    std::ostream::operator<<(in_stack_ffffffffffffff00,*pvVar3);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  for (local_40 = 0; local_40 < *(int *)(in_RDI + 0x48); local_40 = local_40 + 1) {
    local_44 = 0;
    while( true ) {
      iVar8 = local_44;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)local_40);
      if (*pvVar3 <= iVar8) break;
      poVar5 = std::operator<<((ostream *)&std::cout,"Z_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_40);
      poVar5 = std::operator<<(poVar5,"_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_44);
      std::operator<<(poVar5,"=");
      local_48 = 0;
      local_49 = 0;
      local_58 = Plan::get_stations_abi_cxx11_(local_10);
      local_60._M_node =
           (_List_node_base *)
           std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::begin
                     (in_stack_fffffffffffffee8);
      local_68._M_node =
           (_List_node_base *)
           std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::end
                     (in_stack_fffffffffffffee8);
      while( true ) {
        bVar1 = std::operator!=(&local_60,&local_68);
        if (!bVar1) break;
        ppSVar6 = std::_List_const_iterator<imrt::Station_*>::operator*(in_stack_fffffffffffffef0);
        this_00 = *ppSVar6;
        this_01 = Station::getDepositionMatrix(in_stack_ffffffffffffff00,iVar8);
        local_7c = 0;
        while( true ) {
          iVar2 = Station::getNbApertures(this_00);
          if (iVar2 <= local_7c) break;
          local_88 = 0.0;
          Station::open_beamlets_abi_cxx11_(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
          local_b0[0]._M_node =
               (_List_node_base *)
               std::__cxx11::list<int,_std::allocator<int>_>::begin
                         ((list<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8);
          local_b8._M_node =
               (_List_node_base *)
               std::__cxx11::list<int,_std::allocator<int>_>::end
                         ((list<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8);
          while( true ) {
            bVar1 = std::operator!=(local_b0,&local_b8);
            if (!bVar1) break;
            piVar7 = std::_List_iterator<int>::operator*((_List_iterator<int> *)0x168477);
            in_stack_fffffffffffffef0 =
                 (_List_const_iterator<imrt::Station_*> *)
                 maths::Matrix::operator()(this_01,local_44,*piVar7);
            local_88 = (double)in_stack_fffffffffffffef0 + local_88;
            std::_List_iterator<int>::operator++(local_b0);
          }
          std::__cxx11::list<int,_std::allocator<int>_>::~list
                    ((list<int,_std::allocator<int>_> *)0x16846b);
          if (0.0 < local_88) {
            if ((local_49 & 1) != 0) {
              std::operator<<((ostream *)&std::cout," + ");
            }
            poVar5 = (ostream *)std::ostream::operator<<(&std::cout,local_88);
            poVar5 = std::operator<<(poVar5," * I_");
            std::ostream::operator<<(poVar5,local_48);
            local_49 = 1;
          }
          local_48 = local_48 + 1;
          local_7c = local_7c + 1;
        }
        std::_List_const_iterator<imrt::Station_*>::operator++(&local_60);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      local_44 = local_44 + 1;
    }
  }
  return;
}

Assistant:

void EvaluationFunction::generate_linear_system(const Plan& p, vector<double>& w, vector<double>& Zmin, vector<double>& Zmax){
	bool flag=false;
	for(int o=0; o<nb_organs; o++){
		double pen=0.0;
		for(int k=0; k<nb_voxels[o]; k++){
			if(flag) cout << " + ";
			flag = true;
			if(k==0) cout << "(";
			if(Zmin[o] == 0 )
				cout << "max(Z_" << o << "_" << k << "-" << Zmax[o] << ", 0)^2" ;
			else
				cout << "max(" << Zmin[o] << "- Z_" << o << "_" << k << ", 0)^2" ;
			if(k==nb_voxels[o]-1) cout << ")";
		}
		cout << "/" << nb_voxels[o];
	}
	cout << endl;

	for(int o=0; o<nb_organs; o++){
		for(int k=0; k<nb_voxels[o]; k++){
			cout << "Z_" << o << "_" << k << "=" ;
			int ap=0; //aperture variable id
			bool flag = false;
			for(auto s : p.get_stations()){
				const Matrix&  D = s->getDepositionMatrix(o);
				for(int a=0; a<s->getNbApertures(); a++){
					double ap_dose_per_intensity=0.0;
					for(auto b: s->open_beamlets(a)) ap_dose_per_intensity+=D(k,b);

					if (ap_dose_per_intensity>0.0){
						if(flag) cout << " + ";
						cout << ap_dose_per_intensity << " * I_" << ap;
						flag = true;

					}
					ap++;
				}
			}
			cout << endl;
		}
	}
}